

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O2

void test_bhdct_delete_single(planck_unit_test_t *tc)

{
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  
  bhdct_setup(tc,&handler,&dict,ion_fill_none);
  local_90 = 6;
  local_8c = 3;
  bhdct_insert(tc,&dict,&local_8c,&local_90,'\x01');
  local_94 = 3;
  bhdct_delete(tc,&dict,&local_94,'\0',1,'\x01');
  bhdct_takedown(tc,&dict);
  return;
}

Assistant:

void
test_bhdct_delete_single(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;

	bhdct_setup(tc, &handler, &dict, ion_fill_none);

	bhdct_insert(tc, &dict, IONIZE(3, int), IONIZE(6, int), boolean_true);
	bhdct_delete(tc, &dict, IONIZE(3, int), err_ok, 1, boolean_true);

	bhdct_takedown(tc, &dict);
}